

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

csubstr __thiscall c4::yml::Parser::_peek_next_line(Parser *this,size_t pos)

{
  char cVar1;
  ro_substr chars;
  bool bVar2;
  error_flags eVar3;
  char *in_RSI;
  basic_substring<const_char> *in_RDI;
  ro_substr rem_00;
  csubstr cVar4;
  size_t nlpos;
  csubstr rem;
  bool local_184;
  bool local_183;
  basic_substring<const_char> *in_stack_fffffffffffffe80;
  undefined7 in_stack_fffffffffffffe88;
  undefined1 in_stack_fffffffffffffe8f;
  basic_substring<const_char> *in_stack_fffffffffffffe90;
  char *start;
  char *in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffec8;
  basic_substring<char_const> local_130 [16];
  undefined8 local_120;
  undefined8 local_118;
  char *local_100;
  size_t local_f8;
  ulong local_f0;
  basic_substring<const_char> local_e8;
  char *local_d8;
  basic_substring<const_char> local_c8;
  basic_substring<const_char> *local_b8;
  char *local_b0;
  undefined4 local_a8;
  ulong local_a0;
  basic_substring<const_char> *local_98;
  char *local_90;
  undefined4 local_88;
  size_t local_80;
  basic_substring<const_char> *local_78;
  char *local_70;
  undefined4 local_68;
  undefined1 local_59;
  ulong local_58;
  basic_substring<const_char> *local_50;
  char *local_48;
  size_t local_40;
  char local_32;
  char local_31;
  char *local_30;
  undefined4 local_28;
  char *local_20;
  size_t *local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_d8 = in_RSI;
  basic_substring<const_char>::basic_substring(&local_e8);
  start = local_d8;
  if (local_d8 == (char *)0xffffffffffffffff) {
    start = *(char **)(in_RDI[0x9f].str + 0x30);
  }
  local_d8 = start;
  if (start < in_RDI[2].str) {
    local_18 = &in_RDI[1].len;
    local_20 = start;
    if (in_RDI[2].str < start) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_28 = 0x1533;
      handle_error(0x3f0daf,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<char>::basic_substring
              ((basic_substring<char> *)in_stack_fffffffffffffe90,
               (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
               (size_t)in_stack_fffffffffffffe80);
    local_120 = local_10;
    local_118 = local_8;
    rem_00 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3bc4f9);
    cVar4 = from_next_line(rem_00);
    local_100 = cVar4.str;
    local_e8.str = local_100;
    local_f8 = cVar4.len;
    local_e8.len = local_f8;
    local_b8 = &local_e8;
    if (local_f8 != 0 && local_100 != (char *)0x0) {
      basic_substring<char_const>::basic_substring<3ul>(local_130,(char (*) [3])0x404ccc);
      chars.len = in_stack_fffffffffffffec8;
      chars.str = in_stack_fffffffffffffec0;
      local_f0 = basic_substring<const_char>::first_of(in_RDI,chars,(size_t)start);
      if ((local_f0 != 0xffffffffffffffff) && (local_f0 + 1 < local_e8.len)) {
        in_stack_fffffffffffffe90 = &local_e8;
        local_80 = local_f0;
        local_78 = in_stack_fffffffffffffe90;
        if (local_e8.len <= local_f0) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) &&
             (in_stack_fffffffffffffe8f = is_debugger_attached(), (bool)in_stack_fffffffffffffe8f))
          {
            trap_instruction();
          }
          local_90 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_88 = 0x14c3;
          handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        cVar1 = in_stack_fffffffffffffe90->str[local_80];
        local_a0 = local_f0 + 1;
        in_stack_fffffffffffffe80 = &local_e8;
        local_98 = in_stack_fffffffffffffe80;
        if (local_e8.len <= local_a0) {
          eVar3 = get_error_flags();
          if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            trap_instruction();
          }
          local_b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          local_a8 = 0x14c3;
          handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
        }
        local_32 = in_stack_fffffffffffffe80->str[local_a0];
        if ((cVar1 != '\n') || (local_183 = true, local_32 != '\r')) {
          local_184 = cVar1 == '\r' && local_32 == '\n';
          local_183 = local_184;
        }
        local_f0 = local_183 + local_f0;
        local_31 = cVar1;
      }
      local_50 = &local_e8;
      local_58 = local_f0;
      local_59 = 1;
      if (local_e8.len < local_f0 && local_f0 != 0xffffffffffffffff) {
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        local_70 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_68 = 0x1572;
        handle_error(0x3f0daf,(char *)0x1572,"check failed: %s","pos <= len || pos == npos");
      }
      if (local_58 == 0xffffffffffffffff) {
        local_48 = local_e8.str;
        local_40 = local_e8.len;
      }
      else {
        basic_substring<const_char>::basic_substring
                  (in_stack_fffffffffffffe90,
                   (char *)CONCAT17(in_stack_fffffffffffffe8f,in_stack_fffffffffffffe88),
                   (size_t)in_stack_fffffffffffffe80);
      }
      local_c8.str = local_48;
      local_c8.len = local_40;
      goto LAB_003bc99b;
    }
  }
  basic_substring<const_char>::basic_substring(&local_c8);
LAB_003bc99b:
  cVar4.len = local_c8.len;
  cVar4.str = local_c8.str;
  return cVar4;
}

Assistant:

csubstr Parser::_peek_next_line(size_t pos) const
{
    csubstr rem{}; // declare here because of the goto
    size_t nlpos{}; // declare here because of the goto
    pos = pos == npos ? m_state->pos.offset : pos;
    if(pos >= m_buf.len)
        goto next_is_empty;

    // look for the next newline chars, and jump to the right of those
    rem = from_next_line(m_buf.sub(pos));
    if(rem.empty())
        goto next_is_empty;

    // now get everything up to and including the following newline chars
    nlpos = rem.first_of("\r\n");
    if((nlpos != csubstr::npos) && (nlpos + 1 < rem.len))
        nlpos += _extend_from_combined_newline(rem[nlpos], rem[nlpos+1]);
    rem = rem.left_of(nlpos, /*include_pos*/true);

    _c4dbgpf("peek next line @ {}: (len={})'{}'", pos, rem.len, rem.trimr("\r\n"));
    return rem;

next_is_empty:
    _c4dbgpf("peek next line @ {}: (len=0)''", pos);
    return {};
}